

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h263d_parser.c
# Opt level: O3

MPP_RET mpp_h263_parser_flush(H263dParser ctx)

{
  RK_S32 index;
  MppBufSlots slots;
  
  slots = *ctx;
  index = *(RK_S32 *)((long)ctx + 0x88);
  if (((byte)h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"in\n","mpp_h263_parser_flush");
  }
  if (-1 < index && *(int *)((long)ctx + 0x8c) == 0) {
    mpp_buf_slot_set_flag(slots,index,SLOT_QUEUE_USE);
    mpp_buf_slot_enqueue(slots,index,QUEUE_DISPLAY);
    *(undefined4 *)((long)ctx + 0x8c) = 1;
  }
  if (((byte)h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"out\n","mpp_h263_parser_flush");
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_h263_parser_flush(H263dParser ctx)
{
    H263dParserImpl *p = (H263dParserImpl *)ctx;
    MppBufSlots slots = p->frame_slots;
    H263Hdr *hdr_curr = &p->hdr_ref0;
    RK_S32 index = hdr_curr->slot_idx;

    h263d_dbg_func("in\n");

    if (!hdr_curr->enqueued && index >= 0) {
        mpp_buf_slot_set_flag(slots, index, SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(slots, index, QUEUE_DISPLAY);
        hdr_curr->enqueued = 1;
    }

    h263d_dbg_func("out\n");

    return MPP_OK;
}